

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

bool __thiscall ON_PlaneEquation::Transform(ON_PlaneEquation *this,ON_Xform *xform)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dd;
  double zz;
  double yy;
  double xx;
  ON_Xform T;
  bool rc;
  ON_Xform *xform_local;
  ON_PlaneEquation *this_local;
  
  T.m_xform[3][3]._7_1_ = IsValid(this);
  if ((bool)T.m_xform[3][3]._7_1_) {
    memcpy(&xx,xform,0x80);
    T.m_xform[3][3]._7_1_ = ON_Xform::Invert((ON_Xform *)&xx,(double *)0x0);
    if ((bool)T.m_xform[3][3]._7_1_) {
      dVar1 = this->x;
      dVar2 = this->y;
      dVar3 = this->z;
      dVar4 = this->d;
      this->x = T.m_xform[2][3] * dVar4 +
                T.m_xform[1][3] * dVar3 + xx * dVar1 + T.m_xform[0][3] * dVar2;
      this->y = T.m_xform[3][0] * dVar4 +
                T.m_xform[2][0] * dVar3 + T.m_xform[0][0] * dVar1 + T.m_xform[1][0] * dVar2;
      this->z = T.m_xform[3][1] * dVar4 +
                T.m_xform[2][1] * dVar3 + T.m_xform[0][1] * dVar1 + T.m_xform[1][1] * dVar2;
      this->d = T.m_xform[3][2] * dVar4 +
                T.m_xform[2][2] * dVar3 + T.m_xform[0][2] * dVar1 + T.m_xform[1][2] * dVar2;
    }
  }
  return (bool)T.m_xform[3][3]._7_1_;
}

Assistant:

bool ON_PlaneEquation::Transform( const ON_Xform& xform )
{
  bool rc = IsValid();
  if ( rc )
  {
    // Apply the inverse transpose to the equation parameters
    ON_Xform T(xform);
    rc = T.Invert();
    if ( rc )
    {
      const double xx=x;
      const double yy=y;
      const double zz=z;
      const double dd=d;
      x = T.m_xform[0][0]*xx + T.m_xform[1][0]*yy + T.m_xform[2][0]*zz + T.m_xform[3][0]*dd;
      y = T.m_xform[0][1]*xx + T.m_xform[1][1]*yy + T.m_xform[2][1]*zz + T.m_xform[3][1]*dd;
      z = T.m_xform[0][2]*xx + T.m_xform[1][2]*yy + T.m_xform[2][2]*zz + T.m_xform[3][2]*dd;
      d = T.m_xform[0][3]*xx + T.m_xform[1][3]*yy + T.m_xform[2][3]*zz + T.m_xform[3][3]*dd;
    }
  }
  return rc;
}